

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  ostream *this;
  
  test_number_parser();
  test_tokenizer();
  test_0();
  test_1();
  test_2();
  test_arithmetic();
  this = std::operator<<((ostream *)&std::cout,"OK");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main() {
  test_number_parser();
  test_tokenizer();
  test_0();
  test_1();
  test_2();
  test_arithmetic();

  std::cout << "OK" << std::endl;
  return 0;
}